

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch.c
# Opt level: O2

int main(void)

{
  void *pvVar1;
  char *pcVar2;
  
  pvVar1 = bsearch("e","abcde",4,1,compare);
  if (pvVar1 != (void *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x35,"bsearch( \"e\", abcde, 4, 1, compare ) == NULL");
  }
  pcVar2 = (char *)bsearch("e","abcde",5,1,compare);
  if (pcVar2 != "e") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x36,"bsearch( \"e\", abcde, 5, 1, compare ) == &abcde[4]");
  }
  pvVar1 = bsearch("a","bcde",4,1,compare);
  if (pvVar1 != (void *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x37,"bsearch( \"a\", abcde + 1, 4, 1, compare ) == NULL");
  }
  pvVar1 = bsearch("0","abcde",1,1,compare);
  if (pvVar1 != (void *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x38,"bsearch( \"0\", abcde, 1, 1, compare ) == NULL");
  }
  pcVar2 = (char *)bsearch("a","abcde",1,1,compare);
  if (pcVar2 != "abcde") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x39,"bsearch( \"a\", abcde, 1, 1, compare ) == &abcde[0]");
  }
  pvVar1 = bsearch("a","abcde",0,1,compare);
  if (pvVar1 != (void *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x3a,"bsearch( \"a\", abcde, 0, 1, compare ) == NULL");
  }
  pcVar2 = (char *)bsearch("e","abcde",3,2,compare);
  if (pcVar2 != "e") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x3b,"bsearch( \"e\", abcde, 3, 2, compare ) == &abcde[4]");
  }
  pvVar1 = bsearch("b","abcde",3,2,compare);
  if (pvVar1 != (void *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
           ,0x3c,"bsearch( \"b\", abcde, 3, 2, compare ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( bsearch( "e", abcde, 4, 1, compare ) == NULL );
    TESTCASE( bsearch( "e", abcde, 5, 1, compare ) == &abcde[4] );
    TESTCASE( bsearch( "a", abcde + 1, 4, 1, compare ) == NULL );
    TESTCASE( bsearch( "0", abcde, 1, 1, compare ) == NULL );
    TESTCASE( bsearch( "a", abcde, 1, 1, compare ) == &abcde[0] );
    TESTCASE( bsearch( "a", abcde, 0, 1, compare ) == NULL );
    TESTCASE( bsearch( "e", abcde, 3, 2, compare ) == &abcde[4] );
    TESTCASE( bsearch( "b", abcde, 3, 2, compare ) == NULL );
    return TEST_RESULTS;
}